

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleMesh.h
# Opt level: O3

void __thiscall
SimpleMesh<TextureVertex>::SimpleMesh
          (SimpleMesh<TextureVertex> *this,
          vector<TextureVertex,_std::allocator<TextureVertex>_> *vertices,
          vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *indices)

{
  std::vector<TextureVertex,_std::allocator<TextureVertex>_>::vector(&this->vertices,vertices);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            (&this->indices,indices);
  return;
}

Assistant:

SimpleMesh(const std::vector<V> &vertices, const std::vector<std::array<int, 3>> &indices) : vertices(
            vertices), indices(indices) {}